

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O0

void ot::commissioner::persistent_storage::from_json(json *aJson,BorderRouter *aValue)

{
  bool bVar1;
  ErrorCode EVar2;
  const_reference pvVar3;
  Timestamp TVar4;
  bool local_125;
  Error local_108;
  UnixTime local_e0;
  UnixTime timeStamp;
  string timeStr;
  undefined1 local_b0 [7];
  bool condition;
  undefined1 local_78 [8];
  string value_2;
  Error error;
  uint64_t local_28;
  uint64_t value_1;
  BorderRouter *pBStack_18;
  uint32_t value;
  BorderRouter *aValue_local;
  json *aJson_local;
  
  pBStack_18 = aValue;
  aValue_local = (BorderRouter *)aJson;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<ot::commissioner::persistent_storage::BorderRouterId,_0>(pvVar3,&pBStack_18->mId);
  (pBStack_18->mAgent).mPresentFlags = 0;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_ADDR_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_ADDR_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mAddr);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 1;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_PORT_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_PORT_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_short,_0>(pvVar3,&(pBStack_18->mAgent).mPort);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 2;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_THREAD_VERSION_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_THREAD_VERSION_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mThreadVersion);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 4;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_STATE_BITMAP_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_STATE_BITMAP_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_int,_0>(pvVar3,(uint *)((long)&value_1 + 4));
    BorderAgent::State::State((State *)&value_1,value_1._4_4_);
    *(undefined2 *)&(pBStack_18->mAgent).mState = (undefined2)value_1;
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 8;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_NWK_REF_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_NWK_REF_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<ot::commissioner::persistent_storage::NetworkId,_0>(pvVar3,&pBStack_18->mNetworkId);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_VENDOR_NAME_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_VENDOR_NAME_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mVendorName);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x40;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_MODEL_NAME_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_MODEL_NAME_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mModelName);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x80;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_ACTIVE_TIMESTAMP_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_ACTIVE_TIMESTAMP_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_long,_0>(pvVar3,&local_28);
    TVar4 = Timestamp::Decode(local_28);
    (pBStack_18->mAgent).mActiveTimestamp = TVar4;
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x100;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_PARTITION_ID_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_PARTITION_ID_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_int,_0>(pvVar3,&(pBStack_18->mAgent).mPartitionId);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x200;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_VENDOR_DATA_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_VENDOR_DATA_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mVendorData);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x400;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_VENDOR_OUI_abi_cxx11_);
  if (bVar1) {
    Error::Error((Error *)((long)&value_2.field_2 + 8));
    std::__cxx11::string::string((string *)local_78);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_VENDOR_OUI_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78)
    ;
    utils::Hex((Error *)local_b0,&(pBStack_18->mAgent).mVendorOui,(string *)local_78);
    Error::operator=((Error *)((long)&value_2.field_2 + 8),(Error *)local_b0);
    Error::~Error((Error *)local_b0);
    EVar2 = Error::GetCode((Error *)((long)&value_2.field_2 + 8));
    if (EVar2 != kNone) {
      __assert_fail("condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_entries.cpp"
                    ,0x139,
                    "void ot::commissioner::persistent_storage::from_json(const json &, BorderRouter &)"
                   );
    }
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x800;
    std::__cxx11::string::~string((string *)local_78);
    Error::~Error((Error *)((long)&value_2.field_2 + 8));
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_BBR_SEQ_NUMBER_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_BBR_SEQ_NUMBER_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_char,_0>(pvVar3,&(pBStack_18->mAgent).mBbrSeqNumber);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x2000;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_BBR_PORT_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_BBR_PORT_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_short,_0>(pvVar3,&(pBStack_18->mAgent).mBbrPort);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x4000;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_SERVICE_NAME_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_SERVICE_NAME_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,&(pBStack_18->mAgent).mServiceName);
    (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x10000;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)aValue_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_UPDATE_TIMESTAMP_abi_cxx11_);
  if (bVar1) {
    std::__cxx11::string::string((string *)&timeStamp);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)aValue_local,(key_type *)JSON_UPDATE_TIMESTAMP_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &timeStamp);
    UnixTime::UnixTime(&local_e0,0);
    UnixTime::FromString(&local_108,&local_e0,(string *)&timeStamp);
    EVar2 = Error::GetCode(&local_108);
    local_125 = EVar2 == kNone && local_e0.mTime != 0;
    Error::~Error(&local_108);
    if (local_125) {
      (pBStack_18->mAgent).mUpdateTimestamp.mTime = local_e0.mTime;
      (pBStack_18->mAgent).mPresentFlags = (pBStack_18->mAgent).mPresentFlags | 0x20000;
    }
    std::__cxx11::string::~string((string *)&timeStamp);
  }
  return;
}

Assistant:

void from_json(const json &aJson, BorderRouter &aValue)
{
    aJson.at(JSON_ID).get_to(aValue.mId);
    aValue.mAgent.mPresentFlags = 0;
    if (aJson.contains(JSON_ADDR))
    {
        aJson.at(JSON_ADDR).get_to(aValue.mAgent.mAddr);
        aValue.mAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    if (aJson.contains(JSON_PORT))
    {
        aJson.at(JSON_PORT).get_to(aValue.mAgent.mPort);
        aValue.mAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    if (aJson.contains(JSON_THREAD_VERSION))
    {
        aJson.at(JSON_THREAD_VERSION).get_to(aValue.mAgent.mThreadVersion);
        aValue.mAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
    }
    if (aJson.contains(JSON_STATE_BITMAP))
    {
        uint32_t value;
        aJson.at(JSON_STATE_BITMAP).get_to(value);
        aValue.mAgent.mState = BorderAgent::State(value);
        aValue.mAgent.mPresentFlags |= BorderAgent::kStateBit;
    }
    if (aJson.contains(JSON_NWK_REF))
    {
        aJson.at(JSON_NWK_REF).get_to(aValue.mNetworkId);
    }
    if (aJson.contains(JSON_VENDOR_NAME))
    {
        aJson.at(JSON_VENDOR_NAME).get_to(aValue.mAgent.mVendorName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
    }
    if (aJson.contains(JSON_MODEL_NAME))
    {
        aJson.at(JSON_MODEL_NAME).get_to(aValue.mAgent.mModelName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kModelNameBit;
    }
    if (aJson.contains(JSON_ACTIVE_TIMESTAMP))
    {
        uint64_t value;
        aJson.at(JSON_ACTIVE_TIMESTAMP).get_to(value);
        aValue.mAgent.mActiveTimestamp = Timestamp::Decode(value);
        aValue.mAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
    }
    if (aJson.contains(JSON_PARTITION_ID))
    {
        aJson.at(JSON_PARTITION_ID).get_to(aValue.mAgent.mPartitionId);
        aValue.mAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
    }
    if (aJson.contains(JSON_VENDOR_DATA))
    {
        aJson.at(JSON_VENDOR_DATA).get_to(aValue.mAgent.mVendorData);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
    }
    if (aJson.contains(JSON_VENDOR_OUI))
    {
        Error       error;
        std::string value;
        aJson.at(JSON_VENDOR_OUI).get_to(value);
        error = ot::commissioner::utils::Hex(aValue.mAgent.mVendorOui, value);
        ASSERT(error.GetCode() == ErrorCode::kNone);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
    }
    if (aJson.contains(JSON_BBR_SEQ_NUMBER))
    {
        aJson.at(JSON_BBR_SEQ_NUMBER).get_to(aValue.mAgent.mBbrSeqNumber);
        aValue.mAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
    }
    if (aJson.contains(JSON_BBR_PORT))
    {
        aJson.at(JSON_BBR_PORT).get_to(aValue.mAgent.mBbrPort);
        aValue.mAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
    }
    if (aJson.contains(JSON_SERVICE_NAME))
    {
        aJson.at(JSON_SERVICE_NAME).get_to(aValue.mAgent.mServiceName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kServiceNameBit;
    }
    if (aJson.contains(JSON_UPDATE_TIMESTAMP))
    {
        std::string timeStr;
        aJson.at(JSON_UPDATE_TIMESTAMP).get_to(timeStr);
        UnixTime timeStamp;
        if (UnixTime::FromString(timeStamp, timeStr).GetCode() == ErrorCode::kNone && timeStamp.mTime != 0)
        {
            aValue.mAgent.mUpdateTimestamp.mTime = timeStamp.mTime;
            aValue.mAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
        }
    }
}